

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

size_t coda_revnspn(char *s,char *n,size_t len)

{
  bool bVar1;
  char *x;
  char *p;
  char *b;
  size_t len_local;
  char *n_local;
  char *s_local;
  
  p = s + (len - 1);
  x = n;
  while( true ) {
    bVar1 = false;
    if (s + -1 < p) {
      bVar1 = *x != '\0';
    }
    x = n;
    if (!bVar1) break;
    for (; (*x != '\0' && (*p != *x)); x = x + 1) {
    }
    p = p + -1;
  }
  return (size_t)(s + ((len - 1) - (long)p));
}

Assistant:

size_t coda_revnspn(const char *s, const char *n, size_t len)
{
	const char *b = s - 1;
	const char *p = s - 1 + len;
	const char *x = n;

	for (; p > b && *x; --p)
	{
		for (x = n; *x; ++x)
		{
			if (*p == *x) break;
		}
	}

	return s - 1 + len - p;
}